

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

_Bool sparc_cpu_tlb_fill_sparc64
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  int local_68;
  int local_64;
  int access_index;
  int prot;
  int error_code;
  MemTxAttrs attrs;
  target_ulong page_size;
  hwaddr paddr;
  target_ulong vaddr;
  CPUSPARCState_conflict1 *env;
  SPARCCPU_conflict1 *cpu;
  MMUAccessType MStack_28;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  vaddr = (target_ulong)(cs[1].tb_jmp_cache + 0x1f5);
  prot = 0;
  access_index = 0;
  _access_type_local = address & 0xffffffffffffe000;
  env = (CPUSPARCState_conflict1 *)cs;
  cpu._3_1_ = probe;
  cpu._4_4_ = mmu_idx;
  MStack_28 = access_type;
  mmu_idx_local = size;
  address_local = (vaddr)cs;
  access_index = get_physical_address
                           ((CPUSPARCState_conflict1 *)vaddr,&page_size,&local_64,&local_68,
                            (MemTxAttrs *)&prot,_access_type_local,access_type,mmu_idx,
                            (target_ulong *)&error_code);
  if (access_index == 0) {
    paddr = _access_type_local;
    tlb_set_page_with_attrs_sparc64
              ((CPUState *)address_local,_access_type_local,page_size,(MemTxAttrs)prot,local_64,
               cpu._4_4_,_error_code);
    cs_local._7_1_ = true;
  }
  else {
    if ((cpu._3_1_ & 1) == 0) {
      cpu_loop_exit_restore_sparc64((CPUState *)address_local,retaddr);
    }
    cs_local._7_1_ = false;
  }
  return cs_local._7_1_;
}

Assistant:

bool sparc_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                        MMUAccessType access_type, int mmu_idx,
                        bool probe, uintptr_t retaddr)
{
    SPARCCPU *cpu = SPARC_CPU(cs);
    CPUSPARCState *env = &cpu->env;
    target_ulong vaddr;
    hwaddr paddr;
    target_ulong page_size;
    MemTxAttrs attrs = { 0 };
    int error_code = 0, prot, access_index;

    address &= TARGET_PAGE_MASK;
    error_code = get_physical_address(env, &paddr, &prot, &access_index, &attrs,
                                      address, access_type,
                                      mmu_idx, &page_size);
    if (likely(error_code == 0)) {
        vaddr = address;

        tlb_set_page_with_attrs(cs, vaddr, paddr, attrs, prot, mmu_idx,
                                page_size);
        return true;
    }
    if (probe) {
        return false;
    }
    cpu_loop_exit_restore(cs, retaddr);
}